

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layeredopacity.h
# Opt level: O3

void __thiscall LayeredOpacity::initialize(LayeredOpacity *this)

{
  int *this_00;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  **ppvVar1;
  byte bVar2;
  RootWindow *pRVar3;
  undefined1 auVar4 [16];
  TransformNode *this_01;
  Node *child;
  Node *pNVar5;
  element_type *peVar6;
  float *pfVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar8;
  float fVar9;
  rect2d rect;
  vec4 color;
  rect2d rect_00;
  vec4 color_00;
  vec4 color_01;
  shared_ptr<rengine::AbstractAnimation> local_88;
  float local_78;
  element_type *local_68;
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  anim;
  
  (*((((this->super_Example).m_window)->super_StandardSurface).super_Surface.m_impl)->
    _vptr_SurfaceBackendImpl[6])();
  fVar8 = extraout_XMM0_Da / 3.0;
  local_78 = extraout_XMM0_Db / 3.0;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = extraout_XMM0_Db;
  this_01 = rengine::TransformNode::create();
  *(undefined8 *)&(this_01->super_Node).field_0x34 = 0x3f800000;
  *(undefined4 *)&this_01->field_0x3c = 0;
  *(float *)&this_01->field_0x40 = extraout_XMM0_Da * 0.5;
  *(undefined8 *)&this_01->field_0x44 = 0x3f80000000000000;
  *(undefined4 *)&this_01->field_0x4c = 0;
  *(float *)&this_01->field_0x50 =
       anim.
       super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._0_4_ * 0.5;
  *(undefined8 *)&this_01->field_0x54 = 0;
  *(undefined4 *)&this_01->field_0x5c = 0x3f800000;
  *(undefined8 *)&this_01->field_0x60 = 0;
  *(undefined8 *)&this_01->field_0x68 = 0;
  *(undefined8 *)&this_01->field_0x70 = 0x13f800000;
  child = &rengine::OpacityNode::create()->super_Node;
  rengine::Node::append(&this_01->super_Node,child);
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = fVar8 - fVar8;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = local_78 - local_78;
  pNVar5 = (Node *)rengine::RectangleNode::create();
  rect.br.y = anim.
              super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._4_4_;
  rect.br.x = anim.
              super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._0_4_;
  rect.tl = (vec2)(CONCAT44(local_78,fVar8) ^ 0x8000000080000000);
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar5,rect);
  color.z = 0.8;
  color.w = 1.0;
  color.x = 0.5;
  color.y = 0.5;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar5,color);
  rengine::Node::append(child,pNVar5);
  fVar9 = local_78 * -0.5;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = fVar8 + fVar8 * -0.5;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = local_78 + fVar9;
  pNVar5 = (Node *)rengine::RectangleNode::create();
  rect_00.br.y = anim.
                 super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi._4_4_;
  rect_00.br.x = anim.
                 super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi._0_4_;
  rect_00.tl.y = fVar9;
  rect_00.tl.x = fVar8 * -0.5;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar5,rect_00);
  color_00.z = 0.8;
  color_00.w = 1.0;
  color_00.x = 0.5;
  color_00.y = 0.5;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar5,color_00);
  rengine::Node::append(child,pNVar5);
  fVar9 = local_78 + 0.0;
  pNVar5 = (Node *)rengine::RectangleNode::create();
  auVar4._4_4_ = fVar9;
  auVar4._0_4_ = fVar8 + 0.0;
  auVar4._8_8_ = 0;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar5,(rect2d)(auVar4 << 0x40));
  color_01.z = 0.8;
  color_01.w = 1.0;
  color_01.x = 0.5;
  color_01.y = 0.5;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar5,color_01);
  rengine::Node::append(child,pNVar5);
  peVar6 = (element_type *)operator_new(0x58);
  (peVar6->super_AbstractAnimation).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x100000001;
  (peVar6->super_AbstractAnimation).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00145c60;
  this_00 = &(peVar6->super_AbstractAnimation).m_iterations;
  (peVar6->super_AbstractAnimation).m_duration = 0.0;
  bVar2 = *(byte *)&(peVar6->m_keyFrames).
                    super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  *(undefined ***)&(peVar6->super_AbstractAnimation).m_iterations = &PTR__Animation_00145cb0;
  (peVar6->m_keyFrames).
  super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)child;
  (peVar6->m_keyFrames).
  super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar6[1].super_AbstractAnimation.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  peVar6[1].super_AbstractAnimation.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  peVar6->m_target = (OpacityNode *)0x4008000000000000;
  *(byte *)&(peVar6->m_keyFrames).
            super__Vector_base<rengine::KeyFrame<float>,_std::allocator<rengine::KeyFrame<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start = bVar2 & 0xf8 | 4;
  *(undefined4 *)&(peVar6->super_AbstractAnimation).field_0x20 = 0xffffffff;
  local_68 = (element_type *)this_00;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar6;
  pfVar7 = rengine::
           Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
                          *)this_00,0.0);
  *pfVar7 = 1.0;
  pfVar7 = rengine::
           Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame((Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
                          *)this_00,1.0);
  *pfVar7 = 0.0;
  pRVar3 = (this->super_Example).m_window;
  if (__libc_single_threaded == '\0') {
    LOCK();
    ppvVar1 = &(peVar6->super_AbstractAnimation).super_SignalEmitter.m_buckets;
    *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    UNLOCK();
  }
  else {
    ppvVar1 = &(peVar6->super_AbstractAnimation).super_SignalEmitter.m_buckets;
    *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
  }
  local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
  rengine::AnimationManager::start
            (&(pRVar3->super_StandardSurface).m_animationManager,&local_88,0.0);
  if ((element_type *)
      local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->m_animation).super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_animation).
              super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&anim);
  rengine::Node::append((Node *)this,&this_01->super_Node);
  if (anim.
      super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               anim.
               super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  return;
}

Assistant:

void initialize() override {
        vec2 s = size();
        vec2 s3 = s / 3;

        // Root has origin in screen center
        TransformNode *root = TransformNode::create();
        root->setMatrix(mat4::translate2D(s.x * 0.5, s.y * 0.5));

        OpacityNode *opacityNode = OpacityNode::create();
        root->append(opacityNode);

        vec4 color(0.5, 0.5, 0.8, 1.0);

        *opacityNode << RectangleNode::create(rect2d::fromPosSize(-s3, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(-s3/2, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(vec2(), s3), color);

        auto anim = std::make_shared<Animation_OpacityNode_opacity>(opacityNode);
        anim->setDuration(3);
        anim->setDirection(AbstractAnimation::Alternate);
        anim->setIterations(-1);
        anim->newKeyFrame(0) = 1;
        anim->newKeyFrame(1) = 0;

        animationManager()->start(anim);

        m_animation = anim;

        append(root);
    }